

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O0

void idct32_stage7_sse2(__m128i *x,int32_t *cospi,__m128i __rounding,int8_t cos_bit)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  uint uVar25;
  undefined4 uVar26;
  char in_DL;
  long in_RSI;
  undefined1 (*in_RDI) [16];
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  __m128i _in1_7;
  __m128i _in0_7;
  __m128i _in1_6;
  __m128i _in0_6;
  __m128i _in1_5;
  __m128i _in0_5;
  __m128i _in1_4;
  __m128i _in0_4;
  __m128i d1_1;
  __m128i d0_1;
  __m128i c1_1;
  __m128i c0_1;
  __m128i b1_1;
  __m128i b0_1;
  __m128i a1_1;
  __m128i a0_1;
  __m128i v1_1;
  __m128i v0_1;
  __m128i u1_1;
  __m128i u0_1;
  __m128i t1_1;
  __m128i t0_1;
  __m128i d1;
  __m128i d0;
  __m128i c1;
  __m128i c0;
  __m128i b1;
  __m128i b0;
  __m128i a1;
  __m128i a0;
  __m128i v1;
  __m128i v0;
  __m128i u1;
  __m128i u0;
  __m128i t1;
  __m128i t0;
  __m128i _in1_3;
  __m128i _in0_3;
  __m128i _in1_2;
  __m128i _in0_2;
  __m128i _in1_1;
  __m128i _in0_1;
  __m128i _in1;
  __m128i _in0;
  __m128i cospi_p32_p32;
  __m128i cospi_m32_p32;
  undefined2 local_748;
  undefined2 uStack_746;
  undefined2 uStack_744;
  undefined2 uStack_742;
  undefined2 local_738;
  undefined2 uStack_736;
  undefined2 uStack_734;
  undefined2 uStack_732;
  undefined2 local_728;
  undefined2 uStack_726;
  undefined2 uStack_724;
  undefined2 uStack_722;
  undefined2 local_718;
  undefined2 uStack_716;
  undefined2 uStack_714;
  undefined2 uStack_712;
  undefined2 uStack_700;
  undefined2 uStack_6fe;
  undefined2 uStack_6fc;
  undefined2 uStack_6fa;
  undefined2 uStack_6f0;
  undefined2 uStack_6ee;
  undefined2 uStack_6ec;
  undefined2 uStack_6ea;
  undefined2 uStack_6e0;
  undefined2 uStack_6de;
  undefined2 uStack_6dc;
  undefined2 uStack_6da;
  undefined2 uStack_6d0;
  undefined2 uStack_6ce;
  undefined2 uStack_6cc;
  undefined2 uStack_6ca;
  int local_5b8;
  int iStack_5b4;
  int iStack_5b0;
  int iStack_5ac;
  int local_598;
  int iStack_594;
  int iStack_590;
  int iStack_58c;
  int local_578;
  int iStack_574;
  int iStack_570;
  int iStack_56c;
  int local_558;
  int iStack_554;
  int iStack_550;
  int iStack_54c;
  int local_538;
  int iStack_534;
  int iStack_530;
  int iStack_52c;
  int local_518;
  int iStack_514;
  int iStack_510;
  int iStack_50c;
  int local_4f8;
  int iStack_4f4;
  int iStack_4f0;
  int iStack_4ec;
  int local_4e8;
  int iStack_4e4;
  int iStack_4e0;
  int iStack_4dc;
  int local_4d8;
  int iStack_4d4;
  int iStack_4d0;
  int iStack_4cc;
  __m128i _in1_11;
  __m128i _in0_11;
  __m128i _in1_10;
  __m128i _in0_10;
  __m128i _in1_9;
  __m128i _in0_9;
  __m128i _in1_8;
  __m128i _in0_8;
  
  uVar25 = -*(int *)(in_RSI + 0x80) & 0xffffU | *(int *)(in_RSI + 0x80) << 0x10;
  uVar21 = CONCAT44(uVar25,uVar25);
  uVar22 = CONCAT44(uVar25,uVar25);
  uVar26 = CONCAT22(*(undefined2 *)(in_RSI + 0x80),*(undefined2 *)(in_RSI + 0x80));
  uVar23 = CONCAT44(uVar26,uVar26);
  uVar24 = CONCAT44(uVar26,uVar26);
  auVar28 = *in_RDI;
  auVar27 = paddsw(*in_RDI,in_RDI[7]);
  *in_RDI = auVar27;
  auVar28 = psubsw(auVar28,in_RDI[7]);
  in_RDI[7] = auVar28;
  auVar28 = in_RDI[1];
  auVar27 = paddsw(in_RDI[1],in_RDI[6]);
  in_RDI[1] = auVar27;
  auVar28 = psubsw(auVar28,in_RDI[6]);
  in_RDI[6] = auVar28;
  auVar28 = in_RDI[2];
  auVar27 = paddsw(in_RDI[2],in_RDI[5]);
  in_RDI[2] = auVar27;
  auVar28 = psubsw(auVar28,in_RDI[5]);
  in_RDI[5] = auVar28;
  auVar28 = in_RDI[3];
  auVar27 = paddsw(in_RDI[3],in_RDI[4]);
  in_RDI[3] = auVar27;
  auVar28 = psubsw(auVar28,in_RDI[4]);
  in_RDI[4] = auVar28;
  uVar1 = *(undefined8 *)in_RDI[10];
  uVar2 = *(undefined8 *)in_RDI[0xd];
  local_718 = (undefined2)uVar1;
  uStack_716 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_714 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_712 = (undefined2)((ulong)uVar1 >> 0x30);
  local_728 = (undefined2)uVar2;
  uStack_726 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_724 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_722 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = *(undefined8 *)(in_RDI[10] + 8);
  uVar2 = *(undefined8 *)(in_RDI[0xd] + 8);
  uStack_6d0 = (undefined2)uVar1;
  uStack_6ce = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_6cc = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_6ca = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_6e0 = (undefined2)uVar2;
  uStack_6de = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_6dc = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_6da = (undefined2)((ulong)uVar2 >> 0x30);
  auVar12._2_2_ = local_728;
  auVar12._0_2_ = local_718;
  auVar12._4_2_ = uStack_716;
  auVar12._6_2_ = uStack_726;
  auVar12._10_2_ = uStack_724;
  auVar12._8_2_ = uStack_714;
  auVar12._12_2_ = uStack_712;
  auVar12._14_2_ = uStack_722;
  auVar11._8_8_ = uVar22;
  auVar11._0_8_ = uVar21;
  auVar28 = pmaddwd(auVar12,auVar11);
  auVar10._2_2_ = uStack_6e0;
  auVar10._0_2_ = uStack_6d0;
  auVar10._4_2_ = uStack_6ce;
  auVar10._6_2_ = uStack_6de;
  auVar10._10_2_ = uStack_6dc;
  auVar10._8_2_ = uStack_6cc;
  auVar10._12_2_ = uStack_6ca;
  auVar10._14_2_ = uStack_6da;
  auVar9._8_8_ = uVar22;
  auVar9._0_8_ = uVar21;
  auVar27 = pmaddwd(auVar10,auVar9);
  auVar8._2_2_ = local_728;
  auVar8._0_2_ = local_718;
  auVar8._4_2_ = uStack_716;
  auVar8._6_2_ = uStack_726;
  auVar8._10_2_ = uStack_724;
  auVar8._8_2_ = uStack_714;
  auVar8._12_2_ = uStack_712;
  auVar8._14_2_ = uStack_722;
  auVar7._8_8_ = uVar24;
  auVar7._0_8_ = uVar23;
  auVar29 = pmaddwd(auVar8,auVar7);
  auVar6._2_2_ = uStack_6e0;
  auVar6._0_2_ = uStack_6d0;
  auVar6._4_2_ = uStack_6ce;
  auVar6._6_2_ = uStack_6de;
  auVar6._10_2_ = uStack_6dc;
  auVar6._8_2_ = uStack_6cc;
  auVar6._12_2_ = uStack_6ca;
  auVar6._14_2_ = uStack_6da;
  auVar5._8_8_ = uVar24;
  auVar5._0_8_ = uVar23;
  auVar30 = pmaddwd(auVar6,auVar5);
  local_4d8 = auVar28._0_4_;
  iStack_4d4 = auVar28._4_4_;
  iStack_4d0 = auVar28._8_4_;
  iStack_4cc = auVar28._12_4_;
  local_4e8 = (int)in_XMM0_Qa;
  iStack_4e4 = (int)((ulong)in_XMM0_Qa >> 0x20);
  iStack_4e0 = (int)in_XMM0_Qb;
  iStack_4dc = (int)((ulong)in_XMM0_Qb >> 0x20);
  local_4f8 = auVar27._0_4_;
  iStack_4f4 = auVar27._4_4_;
  iStack_4f0 = auVar27._8_4_;
  iStack_4ec = auVar27._12_4_;
  local_518 = auVar29._0_4_;
  iStack_514 = auVar29._4_4_;
  iStack_510 = auVar29._8_4_;
  iStack_50c = auVar29._12_4_;
  local_538 = auVar30._0_4_;
  iStack_534 = auVar30._4_4_;
  iStack_530 = auVar30._8_4_;
  iStack_52c = auVar30._12_4_;
  auVar28 = ZEXT416((uint)(int)in_DL);
  auVar27 = ZEXT416((uint)(int)in_DL);
  auVar29 = ZEXT416((uint)(int)in_DL);
  auVar30 = ZEXT416((uint)(int)in_DL);
  auVar20._4_4_ = iStack_4d4 + iStack_4e4 >> auVar28;
  auVar20._0_4_ = local_4d8 + local_4e8 >> auVar28;
  auVar20._12_4_ = iStack_4cc + iStack_4dc >> auVar28;
  auVar20._8_4_ = iStack_4d0 + iStack_4e0 >> auVar28;
  auVar19._4_4_ = iStack_4f4 + iStack_4e4 >> auVar27;
  auVar19._0_4_ = local_4f8 + local_4e8 >> auVar27;
  auVar19._12_4_ = iStack_4ec + iStack_4dc >> auVar27;
  auVar19._8_4_ = iStack_4f0 + iStack_4e0 >> auVar27;
  auVar28 = packssdw(auVar20,auVar19);
  in_RDI[10] = auVar28;
  auVar18._4_4_ = iStack_514 + iStack_4e4 >> auVar29;
  auVar18._0_4_ = local_518 + local_4e8 >> auVar29;
  auVar18._12_4_ = iStack_50c + iStack_4dc >> auVar29;
  auVar18._8_4_ = iStack_510 + iStack_4e0 >> auVar29;
  auVar17._4_4_ = iStack_534 + iStack_4e4 >> auVar30;
  auVar17._0_4_ = local_538 + local_4e8 >> auVar30;
  auVar17._12_4_ = iStack_52c + iStack_4dc >> auVar30;
  auVar17._8_4_ = iStack_530 + iStack_4e0 >> auVar30;
  auVar28 = packssdw(auVar18,auVar17);
  in_RDI[0xd] = auVar28;
  uVar1 = *(undefined8 *)in_RDI[0xb];
  uVar2 = *(undefined8 *)in_RDI[0xc];
  local_738 = (undefined2)uVar1;
  uStack_736 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_734 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_732 = (undefined2)((ulong)uVar1 >> 0x30);
  local_748 = (undefined2)uVar2;
  uStack_746 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_744 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_742 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = *(undefined8 *)(in_RDI[0xb] + 8);
  uVar2 = *(undefined8 *)(in_RDI[0xc] + 8);
  uStack_6f0 = (undefined2)uVar1;
  uStack_6ee = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_6ec = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_6ea = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_700 = (undefined2)uVar2;
  uStack_6fe = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_6fc = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_6fa = (undefined2)((ulong)uVar2 >> 0x30);
  auVar4._2_2_ = local_748;
  auVar4._0_2_ = local_738;
  auVar4._4_2_ = uStack_736;
  auVar4._6_2_ = uStack_746;
  auVar4._10_2_ = uStack_744;
  auVar4._8_2_ = uStack_734;
  auVar4._12_2_ = uStack_732;
  auVar4._14_2_ = uStack_742;
  auVar31._8_8_ = uVar22;
  auVar31._0_8_ = uVar21;
  auVar31 = pmaddwd(auVar4,auVar31);
  auVar3._2_2_ = uStack_700;
  auVar3._0_2_ = uStack_6f0;
  auVar3._4_2_ = uStack_6ee;
  auVar3._6_2_ = uStack_6fe;
  auVar3._10_2_ = uStack_6fc;
  auVar3._8_2_ = uStack_6ec;
  auVar3._12_2_ = uStack_6ea;
  auVar3._14_2_ = uStack_6fa;
  auVar32._8_8_ = uVar22;
  auVar32._0_8_ = uVar21;
  auVar32 = pmaddwd(auVar3,auVar32);
  auVar30._2_2_ = local_748;
  auVar30._0_2_ = local_738;
  auVar30._4_2_ = uStack_736;
  auVar30._6_2_ = uStack_746;
  auVar30._10_2_ = uStack_744;
  auVar30._8_2_ = uStack_734;
  auVar30._12_2_ = uStack_732;
  auVar30._14_2_ = uStack_742;
  auVar29._8_8_ = uVar24;
  auVar29._0_8_ = uVar23;
  auVar29 = pmaddwd(auVar30,auVar29);
  auVar27._2_2_ = uStack_700;
  auVar27._0_2_ = uStack_6f0;
  auVar27._4_2_ = uStack_6ee;
  auVar27._6_2_ = uStack_6fe;
  auVar27._10_2_ = uStack_6fc;
  auVar27._8_2_ = uStack_6ec;
  auVar27._12_2_ = uStack_6ea;
  auVar27._14_2_ = uStack_6fa;
  auVar28._8_8_ = uVar24;
  auVar28._0_8_ = uVar23;
  auVar28 = pmaddwd(auVar27,auVar28);
  local_558 = auVar31._0_4_;
  iStack_554 = auVar31._4_4_;
  iStack_550 = auVar31._8_4_;
  iStack_54c = auVar31._12_4_;
  local_578 = auVar32._0_4_;
  iStack_574 = auVar32._4_4_;
  iStack_570 = auVar32._8_4_;
  iStack_56c = auVar32._12_4_;
  local_598 = auVar29._0_4_;
  iStack_594 = auVar29._4_4_;
  iStack_590 = auVar29._8_4_;
  iStack_58c = auVar29._12_4_;
  local_5b8 = auVar28._0_4_;
  iStack_5b4 = auVar28._4_4_;
  iStack_5b0 = auVar28._8_4_;
  iStack_5ac = auVar28._12_4_;
  auVar28 = ZEXT416((uint)(int)in_DL);
  auVar27 = ZEXT416((uint)(int)in_DL);
  auVar29 = ZEXT416((uint)(int)in_DL);
  auVar30 = ZEXT416((uint)(int)in_DL);
  auVar16._4_4_ = iStack_554 + iStack_4e4 >> auVar28;
  auVar16._0_4_ = local_558 + local_4e8 >> auVar28;
  auVar16._12_4_ = iStack_54c + iStack_4dc >> auVar28;
  auVar16._8_4_ = iStack_550 + iStack_4e0 >> auVar28;
  auVar15._4_4_ = iStack_574 + iStack_4e4 >> auVar27;
  auVar15._0_4_ = local_578 + local_4e8 >> auVar27;
  auVar15._12_4_ = iStack_56c + iStack_4dc >> auVar27;
  auVar15._8_4_ = iStack_570 + iStack_4e0 >> auVar27;
  auVar28 = packssdw(auVar16,auVar15);
  in_RDI[0xb] = auVar28;
  auVar14._4_4_ = iStack_594 + iStack_4e4 >> auVar29;
  auVar14._0_4_ = local_598 + local_4e8 >> auVar29;
  auVar14._12_4_ = iStack_58c + iStack_4dc >> auVar29;
  auVar14._8_4_ = iStack_590 + iStack_4e0 >> auVar29;
  auVar13._4_4_ = iStack_5b4 + iStack_4e4 >> auVar30;
  auVar13._0_4_ = local_5b8 + local_4e8 >> auVar30;
  auVar13._12_4_ = iStack_5ac + iStack_4dc >> auVar30;
  auVar13._8_4_ = iStack_5b0 + iStack_4e0 >> auVar30;
  auVar28 = packssdw(auVar14,auVar13);
  in_RDI[0xc] = auVar28;
  auVar28 = in_RDI[0x10];
  auVar27 = paddsw(in_RDI[0x10],in_RDI[0x17]);
  in_RDI[0x10] = auVar27;
  auVar28 = psubsw(auVar28,in_RDI[0x17]);
  in_RDI[0x17] = auVar28;
  auVar28 = in_RDI[0x11];
  auVar27 = paddsw(in_RDI[0x11],in_RDI[0x16]);
  in_RDI[0x11] = auVar27;
  auVar28 = psubsw(auVar28,in_RDI[0x16]);
  in_RDI[0x16] = auVar28;
  auVar28 = in_RDI[0x12];
  auVar27 = paddsw(in_RDI[0x12],in_RDI[0x15]);
  in_RDI[0x12] = auVar27;
  auVar28 = psubsw(auVar28,in_RDI[0x15]);
  in_RDI[0x15] = auVar28;
  auVar28 = in_RDI[0x13];
  auVar27 = paddsw(in_RDI[0x13],in_RDI[0x14]);
  in_RDI[0x13] = auVar27;
  auVar28 = psubsw(auVar28,in_RDI[0x14]);
  in_RDI[0x14] = auVar28;
  auVar28 = in_RDI[0x18];
  auVar27 = psubsw(in_RDI[0x1f],in_RDI[0x18]);
  in_RDI[0x18] = auVar27;
  auVar28 = paddsw(in_RDI[0x1f],auVar28);
  in_RDI[0x1f] = auVar28;
  auVar28 = in_RDI[0x19];
  auVar27 = psubsw(in_RDI[0x1e],in_RDI[0x19]);
  in_RDI[0x19] = auVar27;
  auVar28 = paddsw(in_RDI[0x1e],auVar28);
  in_RDI[0x1e] = auVar28;
  auVar28 = in_RDI[0x1a];
  auVar27 = psubsw(in_RDI[0x1d],in_RDI[0x1a]);
  in_RDI[0x1a] = auVar27;
  auVar28 = paddsw(in_RDI[0x1d],auVar28);
  in_RDI[0x1d] = auVar28;
  auVar28 = in_RDI[0x1b];
  auVar27 = psubsw(in_RDI[0x1c],in_RDI[0x1b]);
  in_RDI[0x1b] = auVar27;
  auVar28 = paddsw(in_RDI[0x1c],auVar28);
  in_RDI[0x1c] = auVar28;
  return;
}

Assistant:

static inline void idct32_stage7_sse2(__m128i *x, const int32_t *cospi,
                                      const __m128i __rounding,
                                      int8_t cos_bit) {
  const __m128i cospi_m32_p32 = pair_set_epi16(-cospi[32], cospi[32]);
  const __m128i cospi_p32_p32 = pair_set_epi16(cospi[32], cospi[32]);
  btf_16_adds_subs_sse2(x[0], x[7]);
  btf_16_adds_subs_sse2(x[1], x[6]);
  btf_16_adds_subs_sse2(x[2], x[5]);
  btf_16_adds_subs_sse2(x[3], x[4]);
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x[10], x[13], x[10], x[13]);
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x[11], x[12], x[11], x[12]);
  btf_16_adds_subs_sse2(x[16], x[23]);
  btf_16_adds_subs_sse2(x[17], x[22]);
  btf_16_adds_subs_sse2(x[18], x[21]);
  btf_16_adds_subs_sse2(x[19], x[20]);
  btf_16_subs_adds_sse2(x[31], x[24]);
  btf_16_subs_adds_sse2(x[30], x[25]);
  btf_16_subs_adds_sse2(x[29], x[26]);
  btf_16_subs_adds_sse2(x[28], x[27]);
}